

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O1

event_queue_t * __thiscall
so_5::disp::active_group::impl::
dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
::query_thread_for_group
          (dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
           *this,string *group_name)

{
  anon_class_24_3_35542624 main_action;
  int iVar1;
  iterator iVar2;
  exception_t *this_00;
  _Alloc_hider _Var3;
  shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
  thread;
  anon_class_8_1_6d04ff48 in_stack_ffffffffffffff98;
  _Alloc_hider local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffffb0;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->m_shutdown_started != true) {
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>::thread_with_refcounter_t>_>_>
            ::find(&(this->m_groups)._M_t,group_name);
    if (&(this->m_groups)._M_t._M_impl.super__Rb_tree_header == (_Rb_tree_header *)iVar2._M_node) {
      local_60._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>,std::allocator<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,std::function<std::unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>>()>const&>
                (&local_58,
                 (work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
                  **)&local_60,
                 (allocator<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
                  *)&stack0xffffffffffffff9f,&(this->m_params).m_queue_params.m_lock_factory);
      reuse::work_thread::details::
      work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>::
      start((work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
             *)local_60._M_p);
      main_action.thread =
           (shared_ptr<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>_>
            *)this;
      main_action._0_16_ = in_stack_ffffffffffffffb0;
      details::
      do_with_rollback_on_exception<so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::query_thread_for_group(std::__cxx11::string_const&)::_lambda()_1_,so_5::disp::active_group::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>::query_thread_for_group(std::__cxx11::string_const&)::_lambda()_2_>
                (main_action,in_stack_ffffffffffffff98);
      _Var3._M_p = local_60._M_p;
      if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
      }
    }
    else {
      iVar2._M_node[2]._M_left = (_Base_ptr)((long)&(iVar2._M_node[2]._M_left)->_M_color + 1);
      _Var3._M_p = *(pointer *)(iVar2._M_node + 2);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
    return &(((work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>
               *)_Var3._M_p)->super_activity_tracking_impl_t).
            super_common_data_t<so_5::disp::reuse::work_thread::demand_queue_details::queue_template_t<so_5::disp::reuse::work_thread::demand_queue_details::with_activity_tracking_impl_t>_>
            .m_queue.super_event_queue_t;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  local_60._M_p = &stack0xffffffffffffffb0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"shutdown was initiated","");
  exception_t::exception_t(this_00,(string *)&local_60,0x1f);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

virtual so_5::event_queue_t *
		query_thread_for_group( const std::string & group_name ) override
			{
				std::lock_guard< std::mutex > lock( m_lock );

				if( m_shutdown_started )
					throw so_5::exception_t(
						"shutdown was initiated",
						rc_disp_create_failed );

				auto it = m_groups.find( group_name );

				// If there is a thread for an active group it should be returned.
				if( m_groups.end() != it )
					{
						++(it->second.m_user_agent);
						return it->second.m_thread->get_agent_binding();
					}

				// New thread should be created.
				auto thread = std::make_shared< WORK_THREAD >(
						m_params.queue_params().lock_factory() );

				thread->start();

				so_5::details::do_with_rollback_on_exception(
						[&] {
							m_groups.emplace(
									group_name,
									thread_with_refcounter_t( thread, 1u ) );
						},
						[&thread] { shutdown_and_wait( *thread ); } );

				return thread->get_agent_binding();
			}